

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rpc_client.hpp
# Opt level: O0

void __thiscall
rest_rpc::rpc_client::async_call<0ul>
          (rpc_client *this,string *rpc_name,
          function<void_(std::error_code,_nonstd::sv_lite::basic_string_view<char,_std::char_traits<char>_>)>
          *cb)

{
  basic_string_view<char,_std::char_traits<char>_> __args_1;
  error_code __args;
  bool bVar1;
  basic_string_view<char,_std::char_traits<char>_> *in_RDX;
  rpc_client *in_RDI;
  pair<std::__detail::_Node_iterator<std::pair<const_unsigned_long,_std::shared_ptr<rest_rpc::rpc_client::call_t>_>,_false,_false>,_bool>
  pVar2;
  buffer_type ret;
  msgpack_codec codec;
  shared_ptr<rest_rpc::rpc_client::call_t> call;
  unique_lock<std::mutex> lock;
  uint64_t cb_id;
  int __fd;
  mutex_type *in_stack_ffffffffffffff18;
  undefined4 in_stack_ffffffffffffff20;
  undefined4 in_stack_ffffffffffffff24;
  undefined4 uVar3;
  atomic<bool> *in_stack_ffffffffffffff28;
  error_category *in_stack_ffffffffffffff40;
  unsigned_long *in_stack_ffffffffffffff48;
  function<void_(std::error_code,_nonstd::sv_lite::basic_string_view<char,_std::char_traits<char>_>)>
  *in_stack_ffffffffffffff50;
  io_context *in_stack_ffffffffffffff58;
  undefined1 in_stack_ffffffffffffff80;
  undefined7 in_stack_ffffffffffffff81;
  
  bVar1 = std::atomic::operator_cast_to_bool(in_stack_ffffffffffffff28);
  if (bVar1) {
    std::unique_lock<std::mutex>::unique_lock
              ((unique_lock<std::mutex> *)
               CONCAT44(in_stack_ffffffffffffff24,in_stack_ffffffffffffff20),
               in_stack_ffffffffffffff18);
    in_RDI->callback_id_ = in_RDI->callback_id_ + 1;
    *(byte *)((long)&in_RDI->callback_id_ + 7) = *(byte *)((long)&in_RDI->callback_id_ + 7) | 0x80;
    __fd = (int)in_RDI->callback_id_;
    std::
    make_shared<rest_rpc::rpc_client::call_t,asio::io_context&,std::function<void(std::error_code,nonstd::sv_lite::basic_string_view<char,std::char_traits<char>>)>,unsigned_long>
              (in_stack_ffffffffffffff58,in_stack_ffffffffffffff50,in_stack_ffffffffffffff48);
    std::__shared_ptr_access<rest_rpc::rpc_client::call_t,_(__gnu_cxx::_Lock_policy)2,_false,_false>
    ::operator->((__shared_ptr_access<rest_rpc::rpc_client::call_t,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                  *)0x1ba2dd);
    call_t::start_timer((call_t *)CONCAT71(in_stack_ffffffffffffff81,in_stack_ffffffffffffff80));
    pVar2 = std::
            unordered_map<unsigned_long,std::shared_ptr<rest_rpc::rpc_client::call_t>,std::hash<unsigned_long>,std::equal_to<unsigned_long>,std::allocator<std::pair<unsigned_long_const,std::shared_ptr<rest_rpc::rpc_client::call_t>>>>
            ::emplace<unsigned_long&,std::shared_ptr<rest_rpc::rpc_client::call_t>&>
                      ((unordered_map<unsigned_long,_std::shared_ptr<rest_rpc::rpc_client::call_t>,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::shared_ptr<rest_rpc::rpc_client::call_t>_>_>_>
                        *)in_RDX,(unsigned_long *)in_stack_ffffffffffffff28,
                       (shared_ptr<rest_rpc::rpc_client::call_t> *)
                       CONCAT44(in_stack_ffffffffffffff24,in_stack_ffffffffffffff20));
    uVar3 = CONCAT13(pVar2.second,(int3)in_stack_ffffffffffffff24);
    std::shared_ptr<rest_rpc::rpc_client::call_t>::~shared_ptr
              ((shared_ptr<rest_rpc::rpc_client::call_t> *)0x1ba332);
    std::unique_lock<std::mutex>::~unique_lock
              ((unique_lock<std::mutex> *)CONCAT44(uVar3,in_stack_ffffffffffffff20));
    rpc_service::msgpack_codec::msgpack_codec((msgpack_codec *)0x1ba349);
    rpc_service::msgpack_codec::pack_args<>();
    std::__cxx11::string::data();
    MD5::MD5Hash32((char *)CONCAT44(uVar3,in_stack_ffffffffffffff20));
    write(in_RDI,__fd,(void *)0x0,(size_t)&stack0xffffffffffffff40);
    msgpack::v1::sbuffer::~sbuffer((sbuffer *)0x1ba3a2);
    rpc_service::msgpack_codec::~msgpack_codec((msgpack_codec *)0x1ba3ac);
  }
  else {
    bVar1 = std::function::operator_cast_to_bool
                      ((function<void_(std::error_code,_nonstd::sv_lite::basic_string_view<char,_std::char_traits<char>_>)>
                        *)0x1ba1eb);
    if (bVar1) {
      asio::error::make_error_code(0);
      nonstd::sv_lite::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                (in_RDX,(char *)in_stack_ffffffffffffff28);
      __args._M_cat = in_stack_ffffffffffffff40;
      __args._0_8_ = in_RDI;
      __args_1.size_ = (size_type)in_RDX;
      __args_1.data_ = (const_pointer)in_stack_ffffffffffffff28;
      std::
      function<void_(std::error_code,_nonstd::sv_lite::basic_string_view<char,_std::char_traits<char>_>)>
      ::operator()((function<void_(std::error_code,_nonstd::sv_lite::basic_string_view<char,_std::char_traits<char>_>)>
                    *)CONCAT44(in_stack_ffffffffffffff24,in_stack_ffffffffffffff20),__args,__args_1)
      ;
    }
  }
  return;
}

Assistant:

void async_call(const std::string &rpc_name,
                  std::function<void(asio::error_code, string_view)> cb,
                  Args &&...args) {
    if (!has_connected_) {
      if (cb)
        cb(asio::error::make_error_code(asio::error::not_connected),
           "not connected");
      return;
    }

    uint64_t cb_id = 0;
    {
      std::unique_lock<std::mutex> lock(cb_mtx_);
      callback_id_++;
      callback_id_ |= (uint64_t(1) << 63);
      cb_id = callback_id_;
      auto call = std::make_shared<call_t>(ios_, std::move(cb), TIMEOUT);
      call->start_timer();
      callback_map_.emplace(cb_id, call);
    }

    rpc_service::msgpack_codec codec;
    auto ret = codec.pack_args(std::forward<Args>(args)...);
    write(cb_id, request_type::req_res, std::move(ret),
          MD5::MD5Hash32(rpc_name.data()));
  }